

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O3

void __thiscall MT32Emu::Synth::getPartialStates(Synth *this,Bit8u *partialStates)

{
  bool bVar1;
  int iVar2;
  Partial *this_00;
  TVA *this_01;
  ulong uVar3;
  uint uVar4;
  Bit8u packedStates;
  byte bVar5;
  uint partialNum;
  uint uVar6;
  int iVar7;
  
  if (this->opened != true) {
    memset(partialStates,0,(ulong)(this->partialCount + 3 >> 2));
    return;
  }
  if (this->partialCount != 0) {
    uVar6 = 0;
    uVar3 = 0;
    do {
      iVar7 = 0;
      bVar5 = 0;
      partialNum = uVar6;
      do {
        if (this->partialCount <= partialNum) break;
        this_00 = PartialManager::getPartial(this->partialManager,partialNum);
        bVar1 = Partial::isActive(this_00);
        uVar4 = 0;
        if (bVar1) {
          this_01 = Partial::getTVA(this_00);
          iVar2 = TVA::getPhase(this_01);
          uVar4 = *(uint *)(PARTIAL_PHASE_TO_STATE + (long)iVar2 * 4) & 3;
        }
        bVar5 = bVar5 | (byte)(uVar4 << ((byte)iVar7 & 0x1f));
        iVar7 = iVar7 + 2;
        partialNum = partialNum + 1;
      } while (iVar7 != 8);
      iVar7 = (int)uVar3;
      partialStates[uVar3] = bVar5;
      uVar3 = (ulong)(iVar7 + 1);
      uVar6 = uVar6 + 4;
    } while (iVar7 * 4 + 4U < this->partialCount);
  }
  return;
}

Assistant:

void Synth::getPartialStates(Bit8u *partialStates) const {
	if (!opened) {
		memset(partialStates, 0, ((partialCount + 3) >> 2));
		return;
	}
	for (unsigned int quartNum = 0; (4 * quartNum) < partialCount; quartNum++) {
		Bit8u packedStates = 0;
		for (unsigned int i = 0; i < 4; i++) {
			unsigned int partialNum = (4 * quartNum) + i;
			if (partialCount <= partialNum) break;
			PartialState partialState = getPartialState(partialManager, partialNum);
			packedStates |= (partialState & 3) << (2 * i);
		}
		partialStates[quartNum] = packedStates;
	}
}